

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O0

bool __thiscall RTIMUBMX055::setAccelSampleRate(RTIMUBMX055 *this)

{
  bool bVar1;
  uchar local_19;
  uchar reg;
  RTIMUBMX055 *this_local;
  
  switch(((this->super_RTIMU).m_settings)->m_BMX055AccelSampleRate) {
  case 0:
    local_19 = '\b';
    break;
  case 1:
    local_19 = '\t';
    break;
  case 2:
    local_19 = '\n';
    break;
  case 3:
    local_19 = '\v';
    break;
  case 4:
    local_19 = '\f';
    break;
  case 5:
    local_19 = '\r';
    break;
  case 6:
    local_19 = '\x0e';
    break;
  case 7:
    local_19 = '\x0f';
    break;
  default:
    fprintf(_stderr,"Illegal BMX055 accel FSR code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_BMX055AccelSampleRate);
    return false;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                             this->m_accelSlaveAddr,'\x10',local_19,
                             "Failed to set BMX055 accel rate");
  return bVar1;
}

Assistant:

bool RTIMUBMX055::setAccelSampleRate()
{
    unsigned char reg;

    switch(m_settings->m_BMX055AccelSampleRate) {
    case BMX055_ACCEL_SAMPLERATE_15:
        reg = 0x08;
        break;

    case BMX055_ACCEL_SAMPLERATE_31:
        reg = 0x09;
        break;

    case BMX055_ACCEL_SAMPLERATE_62:
        reg = 0x0a;
        break;

    case BMX055_ACCEL_SAMPLERATE_125:
        reg = 0x0b;
        break;

    case BMX055_ACCEL_SAMPLERATE_250:
        reg = 0x0c;
        break;

    case BMX055_ACCEL_SAMPLERATE_500:
        reg = 0x0d;
        break;

    case BMX055_ACCEL_SAMPLERATE_1000:
        reg = 0x0e;
        break;

    case BMX055_ACCEL_SAMPLERATE_2000:
        reg = 0x0f;
        break;

    default:
        HAL_ERROR1("Illegal BMX055 accel FSR code %d\n", m_settings->m_BMX055AccelSampleRate);
        return false;
    }
    return (m_settings->HALWrite(m_accelSlaveAddr, BMX055_ACCEL_PMU_BW, reg, "Failed to set BMX055 accel rate"));
}